

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_1::UploadWaitDrawCase::deinit(UploadWaitDrawCase *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  RenderPerformanceTestBase::deinit(&this->super_RenderPerformanceTestBase);
  if (this->m_vertexBuffer != 0) {
    iVar1 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_vertexBuffer);
    this->m_vertexBuffer = 0;
  }
  if (this->m_indexBuffer != 0) {
    iVar1 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x438))(1,&this->m_indexBuffer);
    this->m_indexBuffer = 0;
  }
  if (this->m_miscBuffer != 0) {
    iVar1 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_01,iVar1) + 0x438))(1,&this->m_miscBuffer);
    this->m_miscBuffer = 0;
  }
  return;
}

Assistant:

void UploadWaitDrawCase::deinit (void)
{
	RenderPerformanceTestBase::deinit();

	if (m_vertexBuffer)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_vertexBuffer);
		m_vertexBuffer = 0;
	}
	if (m_indexBuffer)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_indexBuffer);
		m_indexBuffer = 0;
	}
	if (m_miscBuffer)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_miscBuffer);
		m_miscBuffer = 0;
	}
}